

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

void fiobj_str_clear(FIOBJ str)

{
  fio_str_info_s local_20;
  
  if (((uint)str & 7) == 2) {
    fio_str_resize(&local_20,(fio_str_s_conflict *)((str & 0xfffffffffffffff8) + 0x10),0);
    *(undefined8 *)((str & 0xfffffffffffffff8) + 8) = 0;
    return;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0xec,"void fiobj_str_clear(FIOBJ)");
}

Assistant:

void fiobj_str_clear(FIOBJ str) {
  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  fio_str_resize(&obj2str(str)->str, 0);
  obj2str(str)->hash = 0;
}